

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int lua_load(lua_State *L,lua_Reader reader,void *data,char *chunkname)

{
  int iVar1;
  char *in_RCX;
  void *in_RDX;
  lua_Reader in_RSI;
  lua_State *in_RDI;
  int status;
  ZIO z;
  char *in_stack_ffffffffffffffd0;
  lua_State *in_stack_ffffffffffffffd8;
  
  if ((lua_State *)in_RCX == (lua_State *)0x0) {
    in_RCX = "?";
  }
  luaZ_init(in_RDI,(ZIO *)&stack0xffffffffffffffb8,in_RSI,in_RDX);
  iVar1 = luaD_protectedparser
                    ((lua_State *)in_RCX,(ZIO *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0)
  ;
  return iVar1;
}

Assistant:

static int lua_load(lua_State*L,lua_Reader reader,void*data,
const char*chunkname){
ZIO z;
int status;
if(!chunkname)chunkname="?";
luaZ_init(L,&z,reader,data);
status=luaD_protectedparser(L,&z,chunkname);
return status;
}